

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>::jls_codec
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *this,
          coding_parameters *param_2,coding_parameters *param_3)

{
  undefined4 uVar1;
  undefined4 uVar2;
  frame_info *pfVar3;
  bool bVar4;
  frame_info frame;
  frame_info local_38;
  coding_parameters *local_28;
  coding_parameters *parameters_local;
  frame_info *frame_info_local;
  jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *this_local;
  
  uVar1 = param_2->interleave_mode;
  uVar2 = param_2->transformation;
  frame.height = uVar2;
  frame.width = uVar1;
  frame._8_8_ = param_3;
  local_28 = param_3;
  parameters_local = param_2;
  frame_info_local = (frame_info *)this;
  local_38 = update_component_count
                       (*(jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>
                          **)param_2,frame,
                        (coding_parameters *)
                        *(jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>
                          **)param_2);
  decoder_strategy::decoder_strategy(&this->super_decoder_strategy,&local_38,local_28);
  (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)&PTR__jls_codec_0018f798;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  this->width_ = parameters_local->near_lossless;
  this->t1_ = 0;
  this->t2_ = 0;
  this->t3_ = 0;
  this->reset_threshold_ = '\0';
  this->restart_interval_ = 0;
  this->restart_interval_counter_ = 0;
  std::array<charls::context_regular_mode,_365UL>::array(&this->contexts_);
  std::array<charls::context_run_mode,_2UL>::array(&this->context_run_mode_);
  this->run_index_ = 0;
  this->previous_line_ = (pixel_type *)0x0;
  this->current_line_ = (pixel_type *)0x0;
  this->quantization_ = (int8_t *)0x0;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->quantization_lut_);
  if (local_28->interleave_mode == None) {
    pfVar3 = frame_info(this);
    bVar4 = true;
    if (pfVar3->component_count == 1) goto LAB_00134779;
  }
  bVar4 = local_28->interleave_mode != None;
LAB_00134779:
  if (!bVar4) {
    __assert_fail("(parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) || parameters.interleave_mode != interleave_mode::none"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6b,
                  "charls::jls_codec<charls::lossless_traits<uint8_t, 8>, charls::decoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::lossless_traits<uint8_t, 8>, Strategy = charls::decoder_strategy]"
                 );
  }
  bVar4 = lossless_traits_impl<unsigned_char,_8>::is_valid();
  if (!bVar4) {
    __assert_fail("traits_.is_valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6c,
                  "charls::jls_codec<charls::lossless_traits<uint8_t, 8>, charls::decoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::lossless_traits<uint8_t, 8>, Strategy = charls::decoder_strategy]"
                 );
  }
  return;
}

Assistant:

jls_codec(Traits traits, const frame_info& frame_info, const coding_parameters& parameters) noexcept :
        Strategy{update_component_count(frame_info, parameters), parameters},
        traits_{std::move(traits)},
        width_{frame_info.width}
    {
        ASSERT((parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) ||
               parameters.interleave_mode != interleave_mode::none);
        ASSERT(traits_.is_valid());
    }